

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2InfoTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::QueryStringCase::iterate(QueryStringCase *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar2;
  undefined1 local_198 [8];
  _func_int **local_190;
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  __s = (char *)(**(code **)(CONCAT44(extraout_var,iVar1) + 0xa78))(this->m_query);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetString() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/tes2InfoTests.cpp"
                  ,0x3b);
  local_198 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,__s,sVar2);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const char*				result	= (const char*)gl.getString(m_query);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString() failed");

		m_testCtx.getLog() << tcu::TestLog::Message << result << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}